

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O0

int Csw_CutFilter(Csw_Man_t *p,Aig_Obj_t *pObj,Csw_Cut_t *pCut)

{
  int iVar1;
  int local_34;
  Csw_Cut_t *pCStack_30;
  int i;
  Csw_Cut_t *pTemp;
  Csw_Cut_t *pCut_local;
  Aig_Obj_t *pObj_local;
  Csw_Man_t *p_local;
  
  local_34 = 0;
  pCStack_30 = Csw_ObjCuts(p,pObj);
  do {
    if (p->nCutsMax <= local_34) {
      return 0;
    }
    if (('\x01' < pCStack_30->nFanins) && (pCStack_30 != pCut)) {
      if (pCut->nFanins < pCStack_30->nFanins) {
        if (((pCStack_30->uSign & pCut->uSign) == pCut->uSign) &&
           (iVar1 = Csw_CutCheckDominance(pCut,pCStack_30), iVar1 != 0)) {
          pCStack_30->nFanins = '\0';
        }
      }
      else if (((pCStack_30->uSign & pCut->uSign) == pCStack_30->uSign) &&
              (iVar1 = Csw_CutCheckDominance(pCStack_30,pCut), iVar1 != 0)) {
        pCut->nFanins = '\0';
        return 1;
      }
    }
    local_34 = local_34 + 1;
    pCStack_30 = Csw_CutNext(pCStack_30);
  } while( true );
}

Assistant:

int Csw_CutFilter( Csw_Man_t * p, Aig_Obj_t * pObj, Csw_Cut_t * pCut )
{ 
    Csw_Cut_t * pTemp;
    int i;
    // go through the cuts of the node
    Csw_ObjForEachCut( p, pObj, pTemp, i )
    {
        if ( pTemp->nFanins < 2 )
            continue;
        if ( pTemp == pCut )
            continue;
        if ( pTemp->nFanins > pCut->nFanins )
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
                continue;
            // check containment seriously
            if ( Csw_CutCheckDominance( pCut, pTemp ) )
            {
                // remove contained cut
                pTemp->nFanins = 0;
            }
         }
        else
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
                continue;
            // check containment seriously
            if ( Csw_CutCheckDominance( pTemp, pCut ) )
            {
                // remove the given
                pCut->nFanins = 0;
                return 1;
            }
        }
    }
    return 0;
}